

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnV128ConstExpr(BinaryReaderIR *this,v128 value_bits)

{
  Location *in_R8;
  v128 val;
  Location local_a8;
  Const *local_88;
  uint32_t auStack_80 [4];
  Const local_70;
  unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> local_38;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_30;
  BinaryReaderIR *local_28;
  BinaryReaderIR *this_local;
  v128 value_bits_local;
  
  auStack_80._0_8_ = value_bits.v._8_8_;
  local_88 = value_bits.v._0_8_;
  local_28 = this;
  unique0x10000103 = local_88;
  value_bits_local.v._0_8_ = auStack_80._0_8_;
  GetLocation(&local_a8,this);
  val.v._8_8_ = &local_a8;
  val.v[0] = auStack_80[0];
  val.v[1] = auStack_80[1];
  Const::V128(&local_70,local_88,val,in_R8);
  MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_38,&local_70);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_30,&local_38);
  value_bits_local.v[2] = (uint32_t)AppendExpr(this,&local_30);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_30);
  std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr(&local_38);
  return (Result)value_bits_local.v[2];
}

Assistant:

Result BinaryReaderIR::OnV128ConstExpr(v128 value_bits) {
  return AppendExpr(
      MakeUnique<ConstExpr>(Const::V128(value_bits, GetLocation())));
}